

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::_InternalSerialize
          (TreeEnsembleParameters_TreeNode *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior TVar2;
  uint uVar3;
  int size;
  uint64_t uVar4;
  uint8_t *puVar5;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *value;
  void *data;
  double dVar6;
  uint64_t raw_relativehitrate;
  double tmp_relativehitrate;
  uint n;
  uint i;
  uint64_t raw_branchfeaturevalue;
  double tmp_branchfeaturevalue;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TreeEnsembleParameters_TreeNode *this_local;
  
  uVar4 = _internal_treeid(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (uVar4 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    uVar4 = _internal_treeid(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(1,uVar4,puVar5);
  }
  uVar4 = _internal_nodeid(this);
  if (uVar4 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar4 = _internal_nodeid(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(2,uVar4,puVar5);
  }
  TVar2 = _internal_nodebehavior(this);
  if (TVar2 != TreeEnsembleParameters_TreeNode_TreeNodeBehavior_BranchOnValueLessThanEqual) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    TVar2 = _internal_nodebehavior(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(3,TVar2,puVar5);
  }
  uVar4 = _internal_branchfeatureindex(this);
  if (uVar4 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar4 = _internal_branchfeatureindex(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(10,uVar4,puVar5);
  }
  dVar6 = _internal_branchfeaturevalue(this);
  if (dVar6 != 0.0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    dVar6 = _internal_branchfeaturevalue(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray(0xb,dVar6,puVar5);
  }
  uVar4 = _internal_truechildnodeid(this);
  if (uVar4 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar4 = _internal_truechildnodeid(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(0xc,uVar4,puVar5);
  }
  uVar4 = _internal_falsechildnodeid(this);
  if (uVar4 != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    uVar4 = _internal_falsechildnodeid(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(0xd,uVar4,puVar5);
  }
  bVar1 = _internal_missingvaluetrackstruechild(this);
  if (bVar1) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_missingvaluetrackstruechild(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteBoolToArray(0xe,bVar1,puVar5);
  }
  tmp_relativehitrate._4_4_ = 0;
  uVar3 = _internal_evaluationinfo_size(this);
  for (; tmp_relativehitrate._4_4_ < uVar3;
      tmp_relativehitrate._4_4_ = tmp_relativehitrate._4_4_ + 1) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _internal_evaluationinfo(this,tmp_relativehitrate._4_4_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                             (0x14,value,puVar5,stream);
  }
  dVar6 = _internal_relativehitrate(this);
  if (dVar6 != 0.0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    dVar6 = _internal_relativehitrate(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray(0x1e,dVar6,puVar5)
    ;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* TreeEnsembleParameters_TreeNode::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 treeId = 1;
  if (this->_internal_treeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(1, this->_internal_treeid(), target);
  }

  // uint64 nodeId = 2;
  if (this->_internal_nodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_nodeid(), target);
  }

  // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
  if (this->_internal_nodebehavior() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      3, this->_internal_nodebehavior(), target);
  }

  // uint64 branchFeatureIndex = 10;
  if (this->_internal_branchfeatureindex() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(10, this->_internal_branchfeatureindex(), target);
  }

  // double branchFeatureValue = 11;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_branchfeaturevalue = this->_internal_branchfeaturevalue();
  uint64_t raw_branchfeaturevalue;
  memcpy(&raw_branchfeaturevalue, &tmp_branchfeaturevalue, sizeof(tmp_branchfeaturevalue));
  if (raw_branchfeaturevalue != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(11, this->_internal_branchfeaturevalue(), target);
  }

  // uint64 trueChildNodeId = 12;
  if (this->_internal_truechildnodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(12, this->_internal_truechildnodeid(), target);
  }

  // uint64 falseChildNodeId = 13;
  if (this->_internal_falsechildnodeid() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(13, this->_internal_falsechildnodeid(), target);
  }

  // bool missingValueTracksTrueChild = 14;
  if (this->_internal_missingvaluetrackstruechild() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_missingvaluetrackstruechild(), target);
  }

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_evaluationinfo_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(20, this->_internal_evaluationinfo(i), target, stream);
  }

  // double relativeHitRate = 30;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_relativehitrate = this->_internal_relativehitrate();
  uint64_t raw_relativehitrate;
  memcpy(&raw_relativehitrate, &tmp_relativehitrate, sizeof(tmp_relativehitrate));
  if (raw_relativehitrate != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(30, this->_internal_relativehitrate(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return target;
}